

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O3

void __thiscall test_matrix_sparse_end_Test::TestBody(test_matrix_sparse_end_Test *this)

{
  initializer_list<double> value;
  Scalar *pSVar1;
  char *pcVar2;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> index;
  iterator iter_const;
  iterator iter;
  Matrix_Sparse matrix;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  undefined1 local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_d0;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_c0;
  pointer local_b8;
  Matrix_Sparse_Row<Disa::Matrix_Sparse> local_a0;
  undefined1 local_90 [112];
  
  local_c8 = (undefined1  [8])0x0;
  pbStack_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_b8 = (pointer)0x2;
  local_90._0_8_ =
       (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )0x1;
  local_90._8_8_ = (pointer)0x1;
  local_90._16_8_ = local_d8;
  local_d8 = (undefined1  [8])0x3ff0000000000000;
  pbStack_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x4000000000000000;
  local_90._24_8_ = (pointer)0x2;
  value._M_len = 2;
  value._M_array = (iterator)local_90._16_8_;
  non_zero._M_len = 3;
  non_zero._M_array = (iterator)local_c8;
  index._M_len = 2;
  index._M_array = (iterator)local_90;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)(local_90 + 0x20),non_zero,index,value,2);
  Disa::Matrix_Sparse::end((Matrix_Sparse *)local_90);
  pbStack_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_90._8_8_ + -1);
  local_d8 = (undefined1  [8])local_90._0_8_;
  local_e8 = (undefined1  [8])0x1;
  pSVar1 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_d8,(size_t *)local_e8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c8,"iter[-1][1]","2.0",*pSVar1,2.0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d8);
    if (pbStack_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_d8 + 8))();
    }
  }
  if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_c0,pbStack_c0);
  }
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_90._8_8_ - 1);
  local_e8 = (undefined1  [8])local_90._0_8_;
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::begin
            ((iterator *)local_c8,(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_e8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_d8,"iter[-1].begin().i_row()","1",
             ((double)CONCAT44(0x45300000,(int)((ulong)local_b8 >> 0x20)) - 1.9342813113834067e+25)
             + ((double)CONCAT44(0x43300000,(int)local_b8) - 4503599627370496.0),1.0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (pbStack_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_c8 + 8))();
    }
  }
  if (pbStack_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_d0,pbStack_d0);
  }
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_90._8_8_ - 1);
  local_e8 = (undefined1  [8])local_90._0_8_;
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::begin
            ((iterator *)local_c8,(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_e8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_d8,"iter[-1].begin().i_column()","1",
             ((double)CONCAT44(0x45300000,(int)(*(size_type *)local_c8 >> 0x20)) -
             1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)*(size_type *)local_c8) - 4503599627370496.0),1.0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (pbStack_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_c8 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_c8 + 8))();
    }
  }
  if (pbStack_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_d0,pbStack_d0);
  }
  Disa::Matrix_Sparse::end((Matrix_Sparse *)local_d8);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&pbStack_d0[-1].field_2 + 0xf);
  local_e8 = local_d8;
  local_a0.matrix = (Matrix_Sparse *)0x1;
  pSVar1 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_e8,(size_t *)&local_a0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c8,"iter_const[-1][1]","2.0",*pSVar1,2.0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (pbStack_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (pbStack_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_e8 + 8))();
    }
  }
  if (pbStack_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_c0,pbStack_c0);
  }
  local_a0.row_index = (long)&pbStack_d0[-1].field_2 + 0xf;
  local_a0.matrix = (Matrix_Sparse *)local_d8;
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::begin((iterator *)local_c8,&local_a0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_e8,"iter_const[-1].begin().i_row()","1",
             ((double)CONCAT44(0x45300000,(int)((ulong)local_b8 >> 0x20)) - 1.9342813113834067e+25)
             + ((double)CONCAT44(0x43300000,(int)local_b8) - 4503599627370496.0),1.0);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_c8 + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_a0.row_index = (long)&pbStack_d0[-1].field_2 + 0xf;
  local_a0.matrix = (Matrix_Sparse *)local_d8;
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::begin((iterator *)local_c8,&local_a0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_e8,"iter_const[-1].begin().i_column()","1",
             ((double)CONCAT44(0x45300000,(int)(*(size_type *)local_c8 >> 0x20)) -
             1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)*(size_type *)local_c8) - 4503599627370496.0),1.0);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_c8 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_c8 + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)(local_90 + 0x20));
  return;
}

Assistant:

TEST(test_matrix_sparse, end) {
  Matrix_Sparse matrix({0, 1, 2}, {1, 1}, {1.0, 2.0}, 2);

  // These are more indirect checks, but essentially we should be looking at the last row's data.
  auto iter = matrix.end();
  EXPECT_DOUBLE_EQ(iter[-1][1], 2.0);
  EXPECT_DOUBLE_EQ(iter[-1].begin().i_row(), 1);
  EXPECT_DOUBLE_EQ(iter[-1].begin().i_column(), 1);

  auto iter_const = matrix.end();
  EXPECT_DOUBLE_EQ(iter_const[-1][1], 2.0);
  EXPECT_DOUBLE_EQ(iter_const[-1].begin().i_row(), 1);
  EXPECT_DOUBLE_EQ(iter_const[-1].begin().i_column(), 1);
}